

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int parse_match_net(vec *vec,usa *sa,int no_strict)

{
  char cVar1;
  int iVar2;
  uint32_t uVar3;
  ushort **ppuVar4;
  long lVar5;
  bool bVar6;
  uint *puVar7;
  uint local_b8;
  byte local_b3;
  uint local_b0;
  undefined1 local_ac;
  uint8_t mask_1;
  uint8_t net_1;
  uint8_t ip_1;
  uint i;
  sockaddr_in6 sin6;
  char *p;
  char ad [50];
  uint32_t mask;
  uint32_t net;
  uint32_t ip;
  uint slash;
  uint d;
  uint c;
  uint b;
  uint a;
  int n;
  int no_strict_local;
  usa *sa_local;
  vec *vec_local;
  
  puVar7 = &b;
  a = no_strict;
  _n = sa;
  sa_local = (usa *)vec;
  iVar2 = __isoc99_sscanf(vec->ptr,"%u.%u.%u.%u/%u%n",&c,&d,&slash,&ip,&net,puVar7);
  if (iVar2 != 5) {
    net = 0x20;
    iVar2 = __isoc99_sscanf(*(undefined8 *)sa_local,"%u.%u.%u.%u%n",&c,&d,&slash,&ip,&b,puVar7);
    if (iVar2 != 4) {
      b = 0;
    }
  }
  if (((int)b < 1) || ((long)(int)b != *(long *)((sa_local->sa).sa_data + 6))) {
    iVar2 = __isoc99_sscanf(*(undefined8 *)sa_local,"[%49[^]]]/%u%n",&p,&net);
    if (iVar2 != 2) {
      net = 0x80;
      iVar2 = __isoc99_sscanf(*(undefined8 *)sa_local,"[%49[^]]]%n",&p,&b);
      if (iVar2 != 1) {
        b = 0;
      }
    }
    if (((int)b < 1) && (a != 0)) {
      sin6._20_8_ = strchr(*(char **)sa_local,0x2f);
      if (((char *)sin6._20_8_ == (char *)0x0) ||
         ((char *)(*(long *)sa_local + *(long *)((sa_local->sa).sa_data + 6)) <= (ulong)sin6._20_8_)
         ) {
        if (*(ulong *)((sa_local->sa).sa_data + 6) < 0x32) {
          b = (uint)*(undefined8 *)((sa_local->sa).sa_data + 6);
          net = 0x80;
          mg_strlcpy((char *)&p,*(char **)sa_local,*(long *)((sa_local->sa).sa_data + 6) + 1);
        }
      }
      else if (((ulong)(sin6._20_8_ - *(long *)sa_local) < 0x32) &&
              (iVar2 = __isoc99_sscanf(sin6._20_8_,"/%u%n",&net,&b), iVar2 == 1)) {
        b = (sin6.sin6_addr.__in6_u._12_4_ - (int)*(undefined8 *)sa_local) + b;
        mg_strlcpy((char *)&p,*(char **)sa_local,(sin6._20_8_ - *(long *)sa_local) + 1);
      }
      else {
        b = 0;
      }
    }
    if (((0 < (int)b) && ((long)(int)b == *(long *)((sa_local->sa).sa_data + 6))) && (net < 0x81)) {
      slash = 0;
      sin6._20_8_ = &p;
      while( true ) {
        ppuVar4 = __ctype_b_loc();
        bVar6 = true;
        if ((((*ppuVar4)[(int)(uint)*(byte *)sin6._20_8_] & 0x1000) == 0) &&
           (bVar6 = true, *(char *)sin6._20_8_ != '.')) {
          bVar6 = *(char *)sin6._20_8_ == ':';
        }
        if (!bVar6) break;
        lVar5 = sin6._20_8_ + 1;
        cVar1 = *(char *)sin6._20_8_;
        sin6._20_8_ = lVar5;
        if (cVar1 == ':') {
          slash = slash + 1;
        }
      }
      if ((*(char *)sin6._20_8_ == '\0') && (1 < slash)) {
        if ((_n->sa).sa_family != 10) {
          return 0;
        }
        iVar2 = mg_inet_pton(10,(char *)&p,&local_ac,0x1c,0);
        if (iVar2 != 0) {
          local_b0 = 0;
          while( true ) {
            if (0xf < local_b0) {
              return 1;
            }
            local_b3 = 0;
            if (local_b0 * 8 + 8 < net) {
              local_b3 = 0xff;
            }
            else if (local_b0 << 3 < net) {
              local_b3 = (byte)(0xff << (((char)(local_b0 << 3) + '\b') - (char)net & 0x1fU));
            }
            if ((*(byte *)((long)_n + (ulong)local_b0 + 8) & local_b3) !=
                *(byte *)((long)&sin6.sin6_family + (ulong)local_b0)) break;
            local_b0 = local_b0 + 1;
          }
          return 0;
        }
      }
    }
  }
  else if ((((c < 0x100) && (d < 0x100)) && (slash < 0x100)) && ((ip < 0x100 && (net < 0x21)))) {
    if ((_n->sa).sa_family == 2) {
      uVar3 = ntohl((_n->sin6).sin6_flowinfo);
      if (net == 0) {
        local_b8 = 0;
      }
      else {
        local_b8 = -1 << (0x20U - (char)net & 0x1f);
      }
      return (uint)((uVar3 & local_b8) == (c << 0x18 | d << 0x10 | slash << 8 | ip));
    }
    return 0;
  }
  return -1;
}

Assistant:

static int
parse_match_net(const struct vec *vec, const union usa *sa, int no_strict)
{
	int n;
	unsigned int a, b, c, d, slash;

	if (sscanf(vec->ptr, "%u.%u.%u.%u/%u%n", &a, &b, &c, &d, &slash, &n)
	    != 5) { // NOLINT(cert-err34-c) 'sscanf' used to convert a string to an
		        // integer value, but function will not report conversion
		        // errors; consider using 'strtol' instead
		slash = 32;
		if (sscanf(vec->ptr, "%u.%u.%u.%u%n", &a, &b, &c, &d, &n)
		    != 4) { // NOLINT(cert-err34-c) 'sscanf' used to convert a string to
			        // an integer value, but function will not report conversion
			        // errors; consider using 'strtol' instead
			n = 0;
		}
	}

	if ((n > 0) && ((size_t)n == vec->len)) {
		if ((a < 256) && (b < 256) && (c < 256) && (d < 256) && (slash < 33)) {
			/* IPv4 format */
			if (sa->sa.sa_family == AF_INET) {
				uint32_t ip = ntohl(sa->sin.sin_addr.s_addr);
				uint32_t net = ((uint32_t)a << 24) | ((uint32_t)b << 16)
				               | ((uint32_t)c << 8) | (uint32_t)d;
				uint32_t mask = slash ? (0xFFFFFFFFu << (32 - slash)) : 0;
				return (ip & mask) == net;
			}
			return 0;
		}
	}
#if defined(USE_IPV6)
	else {
		char ad[50];
		const char *p;

		if (sscanf(vec->ptr, "[%49[^]]]/%u%n", ad, &slash, &n) != 2) {
			slash = 128;
			if (sscanf(vec->ptr, "[%49[^]]]%n", ad, &n) != 1) {
				n = 0;
			}
		}

		if ((n <= 0) && no_strict) {
			/* no square brackets? */
			p = strchr(vec->ptr, '/');
			if (p && (p < (vec->ptr + vec->len))) {
				if (((size_t)(p - vec->ptr) < sizeof(ad))
				    && (sscanf(p, "/%u%n", &slash, &n) == 1)) {
					n += (int)(p - vec->ptr);
					mg_strlcpy(ad, vec->ptr, (size_t)(p - vec->ptr) + 1);
				} else {
					n = 0;
				}
			} else if (vec->len < sizeof(ad)) {
				n = (int)vec->len;
				slash = 128;
				mg_strlcpy(ad, vec->ptr, vec->len + 1);
			}
		}

		if ((n > 0) && ((size_t)n == vec->len) && (slash < 129)) {
			p = ad;
			c = 0;
			/* zone indexes are unsupported, at least two colons are needed */
			while (isxdigit((unsigned char)*p) || (*p == '.') || (*p == ':')) {
				if (*(p++) == ':') {
					c++;
				}
			}
			if ((*p == '\0') && (c >= 2)) {
				struct sockaddr_in6 sin6;
				unsigned int i;

				/* for strict validation, an actual IPv6 argument is needed */
				if (sa->sa.sa_family != AF_INET6) {
					return 0;
				}
				if (mg_inet_pton(AF_INET6, ad, &sin6, sizeof(sin6), 0)) {
					/* IPv6 format */
					for (i = 0; i < 16; i++) {
						uint8_t ip = sa->sin6.sin6_addr.s6_addr[i];
						uint8_t net = sin6.sin6_addr.s6_addr[i];
						uint8_t mask = 0;

						if (8 * i + 8 < slash) {
							mask = 0xFFu;
						} else if (8 * i < slash) {
							mask = (uint8_t)(0xFFu << (8 * i + 8 - slash));
						}
						if ((ip & mask) != net) {
							return 0;
						}
					}
					return 1;
				}
			}
		}
	}
#else
	(void)no_strict;
#endif

	/* malformed */
	return -1;
}